

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

CommandSignature __thiscall
llbuild::buildsystem::ExternalCommand::getSignature(ExternalCommand *this)

{
  bool bVar1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *pvVar2;
  reference ppBVar3;
  CommandSignature *pCVar4;
  StringRef SVar5;
  BuildNode *output;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range1_1;
  BuildNode *input;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range1;
  CommandSignature local_20;
  CommandSignature code;
  ExternalCommand *this_local;
  
  code.value = (uint64_t)this;
  SVar5 = buildsystem::Command::getName(&this->super_Command);
  llbuild::basic::CommandSignature::CommandSignature(&local_20,SVar5);
  pvVar2 = &(this->super_Command).inputs;
  __end1 = std::
           vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ::begin(pvVar2);
  input = (BuildNode *)
          std::
          vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                                *)&input);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
              ::operator*(&__end1);
    SVar5 = Node::getName(&(*ppBVar3)->super_Node);
    pCVar4 = llbuild::basic::CommandSignature::combine(&local_20,SVar5);
    local_20.value = pCVar4->value;
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
    ::operator++(&__end1);
  }
  pvVar2 = &(this->super_Command).outputs;
  __end1_1 = std::
             vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
             ::begin(pvVar2);
  output = (BuildNode *)
           std::
           vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                        *)&output);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
              ::operator*(&__end1_1);
    SVar5 = Node::getName(&(*ppBVar3)->super_Node);
    pCVar4 = llbuild::basic::CommandSignature::combine(&local_20,SVar5);
    local_20.value = pCVar4->value;
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
    ::operator++(&__end1_1);
  }
  pCVar4 = llbuild::basic::CommandSignature::combine(&local_20,(bool)(this->allowMissingInputs & 1))
  ;
  pCVar4 = llbuild::basic::CommandSignature::combine(pCVar4,(bool)(this->allowModifiedOutputs & 1));
  pCVar4 = llbuild::basic::CommandSignature::combine(pCVar4,(bool)(this->alwaysOutOfDate & 1));
  return (CommandSignature)pCVar4->value;
}

Assistant:

CommandSignature ExternalCommand::getSignature() const {
  CommandSignature code(getName());
  for (const auto* input: inputs) {
    code = code.combine(input->getName());
  }
  for (const auto* output: outputs) {
    code = code.combine(output->getName());
  }
  return code
      .combine(allowMissingInputs)
      .combine(allowModifiedOutputs)
      .combine(alwaysOutOfDate);
}